

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O3

ostream * wasm::anon_unknown_0::printLocal(Index index,Function *func,ostream *o)

{
  ostream *poVar1;
  string_view local_28;
  
  local_28 = (string_view)ZEXT816(0);
  if (func != (Function *)0x0) {
    local_28 = (string_view)Function::getLocalNameOrDefault(func,index);
    if (local_28._M_str != (char *)0x0) goto LAB_00a290ea;
  }
  local_28 = (string_view)Name::fromInt((ulong)index);
LAB_00a290ea:
  poVar1 = Name::print((Name *)&local_28,o);
  return poVar1;
}

Assistant:

std::ostream& printLocal(Index index, Function* func, std::ostream& o) {
  Name name;
  if (func) {
    name = func->getLocalNameOrDefault(index);
  }
  if (!name) {
    name = Name::fromInt(index);
  }
  return name.print(o);
}